

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode http_write_header(Curl_easy *data,char *hd,size_t hdlen)

{
  uint uVar1;
  uint local_34;
  int writetype;
  CURLcode result;
  size_t hdlen_local;
  char *hd_local;
  Curl_easy *data_local;
  
  Curl_debug(data,CURLINFO_HEADER_IN,hd,hdlen);
  uVar1 = 0;
  if ((data->req).httpcode / 100 == 1) {
    uVar1 = 0x20;
  }
  data_local._4_4_ = Curl_client_write(data,uVar1 | 4,hd,hdlen);
  if ((data_local._4_4_ == CURLE_OK) &&
     (data_local._4_4_ = Curl_bump_headersize(data,hdlen,false), data_local._4_4_ == CURLE_OK)) {
    if (((data->req).httpcode < 100) || (199 < (data->req).httpcode)) {
      local_34 = 0;
    }
    else {
      local_34 = (data->req).headerbytecount;
    }
    (data->req).deductheadercount = local_34;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode http_write_header(struct Curl_easy *data,
                                  const char *hd, size_t hdlen)
{
  CURLcode result;
  int writetype;

  /* now, only output this if the header AND body are requested:
   */
  Curl_debug(data, CURLINFO_HEADER_IN, (char *)hd, hdlen);

  writetype = CLIENTWRITE_HEADER |
    ((data->req.httpcode/100 == 1) ? CLIENTWRITE_1XX : 0);

  result = Curl_client_write(data, writetype, hd, hdlen);
  if(result)
    return result;

  result = Curl_bump_headersize(data, hdlen, FALSE);
  if(result)
    return result;

  data->req.deductheadercount = (100 <= data->req.httpcode &&
                                 199 >= data->req.httpcode) ?
    data->req.headerbytecount : 0;
  return result;
}